

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerStSlotChkUndecl(Lowerer *this,Instr *instrStSlot)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *opnd;
  Instr *instrInsert;
  
  if (instrStSlot->m_src2 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2b6e,"(instrStSlot->GetSrc2() != nullptr)",
                       "instrStSlot->GetSrc2() != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  IR::Instr::FreeSrc2(instrStSlot);
  opnd = CreateOpndForSlotAccess(this,instrStSlot->m_dst);
  instrInsert = LowerStSlot(this,instrStSlot);
  GenUndeclChk(this,instrInsert,opnd);
  return instrInsert;
}

Assistant:

IR::Instr *
Lowerer::LowerStSlotChkUndecl(IR::Instr *instrStSlot)
{
    Assert(instrStSlot->GetSrc2() != nullptr);

    // Src2 is required only to avoid dead store false positives during GlobOpt.
    instrStSlot->FreeSrc2();

    IR::Opnd *dstOpnd = this->CreateOpndForSlotAccess(instrStSlot->GetDst());
    IR::Instr *instr = this->LowerStSlot(instrStSlot);

    this->GenUndeclChk(instr, dstOpnd);

    return instr;
}